

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O3

ssize_t __thiscall
sc_core::vcd_sc_fxnum_fast_trace::write
          (vcd_sc_fxnum_fast_trace *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  sc_fxnum_fast *extraout_RAX;
  sc_fxnum_fast *psVar7;
  sc_fxnum_fast *this_00;
  undefined4 in_register_00000034;
  pointer pcVar8;
  size_type __n_00;
  allocator_type local_52;
  value_type_conflict local_51;
  FILE *local_50;
  vector<char,_std::allocator<char>_> local_48;
  
  local_50 = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (write(_IO_FILE*)::compdata == '\0') {
    iVar6 = __cxa_guard_acquire(&write(_IO_FILE*)::compdata);
    if (iVar6 != 0) {
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x400);
      pcVar8 = write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x400;
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pcVar8;
      memset(write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x400);
      write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar8;
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::compdata,&__dso_handle)
      ;
      __cxa_guard_release(&write(_IO_FILE*)::compdata);
    }
  }
  if (write(_IO_FILE*)::rawdata == '\0') {
    iVar6 = __cxa_guard_acquire(&write(_IO_FILE*)::rawdata);
    if (iVar6 != 0) {
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)operator_new(0x400);
      pcVar8 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + 0x400;
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = pcVar8;
      memset(write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,0,0x400);
      write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = pcVar8;
      __cxa_atexit(std::vector<char,_std::allocator<char>_>::~vector,&write::rawdata,&__dso_handle);
      __cxa_guard_release(&write(_IO_FILE*)::rawdata);
    }
  }
  iVar6 = (this->object->m_params).m_type_params.m_wl;
  if ((ulong)((long)write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) <= (ulong)(long)iVar6) {
    __n_00 = ((long)iVar6 & 0xfffffffffffff000U) + 0x1000;
    local_51 = '\0';
    std::vector<char,_std::allocator<char>_>::vector(&local_48,__n_00,&local_51,&local_52);
    pcVar4 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pcVar3 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar2 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar8 = write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar2;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
    write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar4;
    if (pcVar8 != (pointer)0x0) {
      operator_delete(pcVar8);
    }
    local_51 = '\0';
    std::vector<char,_std::allocator<char>_>::vector(&local_48,__n_00,&local_51,&local_52);
    pcVar4 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pcVar3 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar2 = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar8 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar2;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar3;
    write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar4;
    if (pcVar8 != (pointer)0x0) {
      operator_delete(pcVar8);
    }
    iVar6 = (this->object->m_params).m_type_params.m_wl;
  }
  pcVar8 = write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < iVar6) {
    do {
      psVar7 = this->object;
      iVar1 = (psVar7->m_params).m_type_params.m_wl;
      if (iVar1 < iVar6) {
        sc_report_handler::report
                  (SC_ERROR,"index out of range",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/fx/sc_fxnum.h"
                   ,0x11be);
        sc_abort();
      }
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                    .super__Vector_impl_data._M_finish._4_4_,
                                    iVar6 + ((psVar7->m_params).m_type_params.m_iwl - iVar1) + -1);
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)psVar7;
      bVar5 = sc_dt::sc_fxnum_fast_bitref_r::get((sc_fxnum_fast_bitref_r *)&local_48);
      *pcVar8 = "01"[bVar5];
      pcVar8 = pcVar8 + 1;
      bVar5 = 1 < iVar6;
      iVar6 = iVar6 + -1;
    } while (bVar5);
  }
  *pcVar8 = '\0';
  vcd_trace::compose_data_line
            (&this->super_vcd_trace,
             write::rawdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  fputs(write::compdata.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start,local_50);
  psVar7 = this->object;
  this_00 = &this->old_value;
  if (psVar7 != this_00) {
    this_00->m_val = psVar7->m_val;
    sc_dt::sc_fxnum_fast::cast(this_00);
    psVar7 = extraout_RAX;
  }
  return (ssize_t)psVar7;
}

Assistant:

void
vcd_sc_fxnum_fast_trace::write( FILE* f )
{
    static std::vector<char> compdata(1024), rawdata(1024);
    typedef std::vector<char>::size_type size_t;

    if ( compdata.size() <= static_cast<size_t>(object.wl()) ) { // include trailing \0
        size_t sz = ( static_cast<size_t>(object.wl()) + 4096 ) & (~static_cast<size_t>(4096-1));
        std::vector<char>( sz ).swap( compdata ); // resize without copying values
        std::vector<char>( sz ).swap( rawdata );
    }
    char *rawdata_ptr  = &rawdata[0];

    for(int bitindex = object.wl() - 1; bitindex >= 0; -- bitindex )
    {
        *rawdata_ptr ++ = "01"[object[bitindex]];
    }
    *rawdata_ptr = '\0';
    compose_data_line( &rawdata[0], &compdata[0] );

    std::fputs( &compdata[0], f );
    old_value = object;
}